

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

benchmark * __thiscall
picobench::registry::add_benchmark(registry *this,char *name,benchmark_proc proc)

{
  benchmark_impl *this_00;
  vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
  *this_01;
  benchmark_impl *local_28;
  benchmark_impl *b;
  benchmark_proc proc_local;
  char *name_local;
  registry *this_local;
  
  b = (benchmark_impl *)proc;
  proc_local = (benchmark_proc)name;
  name_local = (char *)this;
  this_00 = (benchmark_impl *)operator_new(0x60);
  benchmark_impl::benchmark_impl(this_00,(char *)proc_local,(benchmark_proc)b);
  local_28 = this_00;
  this_01 = (vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
             *)benchmarks_for_current_suite(this);
  std::
  vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
  ::emplace_back<picobench::benchmark_impl*&>(this_01,&local_28);
  return &local_28->super_benchmark;
}

Assistant:

benchmark& add_benchmark(const char* name, benchmark_proc proc)
    {
        auto b = new benchmark_impl(name, proc);
        benchmarks_for_current_suite().emplace_back(b);
        return *b;
    }